

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
AppSolutionHandlerTest_PrintSolution_Test::~AppSolutionHandlerTest_PrintSolution_Test
          (AppSolutionHandlerTest_PrintSolution_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AppSolutionHandlerTest, PrintSolution) {
  TestSolver solver;
  StrictMockProblemBuilder problem_builder;
  mp::internal::AppSolutionHandler<TestSolver, MockSolWriter<>>
      handler("test", solver, problem_builder, mp::ArrayRef<long>(0, 0), 0);
  const double values[] = {1.5, 2.5, 3.5};
  const double dual_values[] = {4.5, 5.5};
  EXPECT_CALL(problem_builder, num_vars()).WillRepeatedly(Return(3));
  EXPECT_CALL(problem_builder, num_algebraic_cons()).WillRepeatedly(Return(2));

  EXPECT_WRITE(stdout,
               handler.HandleSolution(0, "test msg", values, dual_values, 0),
               "test msg\n");

  solver.set_wantsol(Solver::PRINT_SOLUTION);
  EXPECT_WRITE(stdout,
               handler.HandleSolution(0, "test msg", values, dual_values, 0),
               "test msg\n\n"
               "variable  value\n"
               "_svar[1]  1.5\n"
               "_svar[2]  2.5\n"
               "_svar[3]  3.5\n");

  solver.set_wantsol(Solver::PRINT_DUAL_SOLUTION);
  EXPECT_WRITE(stdout,
               handler.HandleSolution(0, "test msg", values, dual_values, 0),
               "test msg\n\n"
               "constraint  dual value\n"
               "_scon[1]    4.5\n"
               "_scon[2]    5.5\n");

  solver.set_wantsol(Solver::PRINT_SOLUTION | Solver::PRINT_DUAL_SOLUTION);
  EXPECT_WRITE(stdout,
               handler.HandleSolution(0, "test msg", values, dual_values, 0),
               "test msg\n\n"
               "variable  value\n"
               "_svar[1]  1.5\n"
               "_svar[2]  2.5\n"
               "_svar[3]  3.5\n\n"
               "constraint  dual value\n"
               "_scon[1]    4.5\n"
               "_scon[2]    5.5\n");

  solver.set_wantsol(Solver::SUPPRESS_SOLVER_MSG | Solver::PRINT_SOLUTION);
  EXPECT_WRITE(stdout,
               handler.HandleSolution(0, "test msg", values, dual_values, 0),
               "\n"
               "variable  value\n"
               "_svar[1]  1.5\n"
               "_svar[2]  2.5\n"
               "_svar[3]  3.5\n");
}